

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O3

void putseparate8bitYCbCr11tile
               (TIFFRGBAImage *img,uint32_t *cp,uint32_t x,uint32_t y,uint32_t w,uint32_t h,
               int32_t fromskew,int32_t toskew,uchar *r,uchar *g,uchar *b,uchar *a)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint32_t uVar4;
  uint32_t db;
  uint32_t local_64;
  uint32_t local_60;
  uint local_5c;
  long local_58;
  long local_50;
  TIFFRGBAImage *local_48;
  byte *local_40;
  uint *local_38;
  
  if (h != 0) {
    local_50 = (long)fromskew;
    local_58 = (long)toskew << 2;
    local_40 = g;
    uVar4 = w;
    local_48 = img;
    do {
      do {
        bVar1 = *r;
        r = r + 1;
        bVar2 = *local_40;
        local_40 = local_40 + 1;
        bVar3 = *b;
        b = b + 1;
        local_38 = cp;
        TIFFYCbCrtoRGB(local_48->ycbcr,(uint)bVar1,(uint)bVar2,(uint)bVar3,&local_5c,&local_60,
                       &local_64);
        *local_38 = local_60 << 8 | local_5c | local_64 << 0x10 | 0xff000000;
        cp = local_38 + 1;
        uVar4 = uVar4 - 1;
      } while (uVar4 != 0);
      r = r + local_50;
      local_40 = local_40 + local_50;
      b = b + local_50;
      cp = (uint32_t *)((long)cp + local_58);
      h = h - 1;
      uVar4 = w;
    } while (h != 0);
  }
  return;
}

Assistant:

DECLARESepPutFunc(putseparate8bitYCbCr11tile)
{
    (void)y;
    (void)a;
    /* TODO: naming of input vars is still off, change obfuscating declaration
     * inside define, or resolve obfuscation */
    for (; h > 0; --h)
    {
        x = w;
        do
        {
            uint32_t dr, dg, db;
            TIFFYCbCrtoRGB(img->ycbcr, *r++, *g++, *b++, &dr, &dg, &db);
            *cp++ = PACK(dr, dg, db);
        } while (--x);
        SKEW(r, g, b, fromskew);
        cp += toskew;
    }
}